

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

uint32_t upb_Arena_DebugRefCount(upb_Arena *a)

{
  uintptr_t uVar1;
  upb_ArenaRoot uVar2;
  
  uVar2 = _upb_Arena_FindRoot((upb_ArenaInternal *)(a + 1));
  uVar1 = _upb_Arena_RefCountFromTagged(uVar2.tagged_count);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t upb_Arena_DebugRefCount(const upb_Arena* a) {
  uintptr_t tagged = _upb_Arena_FindRoot(upb_Arena_Internal(a)).tagged_count;
  return (uint32_t)_upb_Arena_RefCountFromTagged(tagged);
}